

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void dump_stats(string *stats_path,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *foz_paths)

{
  undefined6 uVar1;
  bool bVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *rhs
  ;
  Value v;
  Data local_108;
  undefined8 *local_f8;
  undefined8 *puStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  Data local_a8;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_98;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_68 = 0;
  local_60 = 0x400;
  local_58 = 0;
  local_50 = 0;
  allocator = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)operator_new(0x28);
  allocator->chunkHead_ = (ChunkHeader *)0x0;
  allocator->chunk_capacity_ = 0x10000;
  allocator->userBuffer_ = (void *)0x0;
  allocator->baseAllocator_ = (CrtAllocator *)0x0;
  allocator->ownBaseAllocator_ = (CrtAllocator *)0x0;
  local_a8.n = (Number)0x0;
  local_a8._8_6_ = 0;
  uVar1 = local_a8._8_6_;
  local_a8._8_6_ = 0;
  local_a8.f.flags = 4;
  local_98 = allocator;
  local_90 = allocator;
  if (foz_paths != in_RDX) {
    do {
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_f8 = (undefined8 *)0x0;
      puStack_f0 = (undefined8 *)0x0;
      local_108.n.i64 = (Number)0x0;
      local_108.s.str = (Ch *)0x0;
      local_c8 = 0;
      local_c0 = 0x400;
      local_b8 = 0;
      local_b0 = 0;
      local_f8 = (undefined8 *)operator_new(0x28);
      *local_f8 = 0;
      local_f8[1] = 0x10000;
      local_f8[2] = 0;
      local_f8[3] = 0;
      local_f8[4] = 0;
      puStack_f0 = local_f8;
      bVar2 = parse_json_stats(*(string **)foz_paths,(Document *)&local_108.s);
      if (bVar2) {
        if ((local_a8.f.flags != 4) || (local_108.f.flags != 4)) {
          __assert_fail("IsArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x66a,
                        "SizeType rapidjson::GenericValue<rapidjson::UTF8<>>::Size() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::Reserve((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_a8.s,local_108.s.length + local_a8.s.length,allocator);
        if (local_108.f.flags != 4) {
          __assert_fail("IsArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                        ,0x68c,
                        "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::Begin() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        rhs = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)((ulong)local_108.s.str & 0xffffffffffff);
        while (rhs != (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)(((ulong)local_108.n & 0xffffffff) * 0x10 +
                         ((ulong)local_108.s.str & 0xffffffffffff))) {
          local_48 = 0;
          uStack_40 = 0;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          ::CopyFrom<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                    ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      *)&local_48,rhs,allocator,false);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_a8.s,
                     (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)&local_48,allocator);
          rhs = rhs + 1;
          if (local_108.f.flags != 4) {
            __assert_fail("IsArray()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                          ,0x68f,
                          "ValueIterator rapidjson::GenericValue<rapidjson::UTF8<>>::End() [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                         );
          }
        }
        remove((char *)*(pointer *)foz_paths);
      }
      rapidjson::
      GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
      ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                          *)&local_108.s);
      foz_paths = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)foz_paths + 0x20);
      uVar1 = local_a8._8_6_;
    } while (foz_paths != in_RDX);
  }
  local_a8._8_6_ = uVar1;
  stats_to_csv(stats_path,(Document *)&local_a8.s);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)&local_a8.s);
  return;
}

Assistant:

static void dump_stats(const std::string &stats_path, const std::vector<std::string> &foz_paths)
{
	rapidjson::Document doc;
	doc.SetArray();
	auto &alloc = doc.GetAllocator();

	for (auto &sp : foz_paths)
	{
		rapidjson::Document tmp_doc;
		if (!parse_json_stats(sp, tmp_doc))
			continue;

		doc.Reserve(doc.Size() + tmp_doc.Size(), alloc);
		for (auto itr = tmp_doc.Begin(); itr != tmp_doc.End(); itr++)
		{
			rapidjson::Value v;
			v.CopyFrom(*itr, alloc);
			doc.PushBack(v, alloc);
		}
		remove(sp.c_str());
	}

	stats_to_csv(stats_path, doc);
}